

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O0

location_type_t parse_location_type(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(value,""), iVar1 == 0)) {
    return LT_STOP;
  }
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    return LT_STATION;
  }
  iVar1 = strcmp(value,"2");
  if (iVar1 == 0) {
    return LT_STATION_ENTRANCE_EXIT;
  }
  return LT_NOT_SET;
}

Assistant:

location_type_t parse_location_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return LT_STOP;
    else if (strcmp(value, "1") == 0)
        return LT_STATION;
    else if (strcmp(value, "2") == 0)
        return LT_STATION_ENTRANCE_EXIT;
    else
        return LT_NOT_SET;
}